

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

DWARFDebugNames * __thiscall llvm::DWARFContext::getDebugNames(DWARFContext *this)

{
  DWARFObject *pDVar1;
  DataExtractor StringSection;
  ulong uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DWARFDebugNames *this_00;
  DWARFDebugNames *pDVar6;
  size_t extraout_RDX;
  ulong uVar7;
  undefined1 auStack_90 [8];
  DWARFDataExtractor AccelSection;
  undefined6 uStack_56;
  Error local_40;
  ulong local_38;
  Error E;
  DWARFObject *pDVar5;
  
  pDVar1 = (this->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  iVar3 = (*pDVar1->_vptr_DWARFObject[0x27])(pDVar1);
  pDVar5 = (DWARFObject *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*((this->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[0x11])();
  iVar4 = (*((this->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[5])();
  pDVar6 = (this->Names)._M_t.
           super___uniq_ptr_impl<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::DWARFDebugNames_*,_std::default_delete<llvm::DWARFDebugNames>_>
           .super__Head_base<0UL,_llvm::DWARFDebugNames_*,_false>._M_head_impl;
  if (pDVar6 == (DWARFDebugNames *)0x0) {
    auStack_90 = (undefined1  [8])pDVar5->_vptr_DWARFObject;
    AccelSection.super_DataExtractor.Data.Data = (pDVar5->Dummy).Data.Data;
    AccelSection.super_DataExtractor.Data.Length._1_1_ = 0;
    AccelSection.super_DataExtractor.Data.Length._0_1_ = (byte)iVar4;
    AccelSection.super_DataExtractor._16_8_ = pDVar1;
    AccelSection.Obj = pDVar5;
    this_00 = (DWARFDebugNames *)operator_new(0x70);
    StringSection.AddressSize = '\0';
    StringSection.IsLittleEndian = (byte)iVar4;
    StringSection._18_6_ = uStack_56;
    StringSection.Data.Length = extraout_RDX;
    StringSection.Data.Data = (char *)CONCAT44(extraout_var_00,iVar3);
    AccelSection.Section = (DWARFSection *)CONCAT44(extraout_var_00,iVar3);
    DWARFDebugNames::DWARFDebugNames(this_00,(DWARFDataExtractor *)auStack_90,StringSection);
    pDVar6 = (this->Names)._M_t.
             super___uniq_ptr_impl<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFDebugNames_*,_std::default_delete<llvm::DWARFDebugNames>_>
             .super__Head_base<0UL,_llvm::DWARFDebugNames_*,_false>._M_head_impl;
    (this->Names)._M_t.
    super___uniq_ptr_impl<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>._M_t.
    super__Tuple_impl<0UL,_llvm::DWARFDebugNames_*,_std::default_delete<llvm::DWARFDebugNames>_>.
    super__Head_base<0UL,_llvm::DWARFDebugNames_*,_false>._M_head_impl = this_00;
    if (pDVar6 != (DWARFDebugNames *)0x0) {
      (**(code **)((long)(pDVar6->super_DWARFAcceleratorTable)._vptr_DWARFAcceleratorTable + 8))();
      this_00 = (this->Names)._M_t.
                super___uniq_ptr_impl<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>
                ._M_t.
                super__Tuple_impl<0UL,_llvm::DWARFDebugNames_*,_std::default_delete<llvm::DWARFDebugNames>_>
                .super__Head_base<0UL,_llvm::DWARFDebugNames_*,_false>._M_head_impl;
    }
    (*(this_00->super_DWARFAcceleratorTable)._vptr_DWARFAcceleratorTable[2])(&local_38,this_00);
    uVar7 = local_38 & 0xfffffffffffffffe;
    uVar2 = uVar7 != 0 | uVar7;
    if (uVar7 != 0) {
      local_40.Payload = (ErrorInfoBase *)(local_38 | 1);
      local_38 = 0;
      consumeError(&local_40);
      uVar2 = local_38;
      if ((long *)((ulong)local_40.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_40.Payload & 0xfffffffffffffffe) + 8))();
        uVar2 = local_38;
      }
    }
    local_38 = uVar2;
    if ((long *)(local_38 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_38 & 0xfffffffffffffffe) + 8))();
    }
    pDVar6 = (this->Names)._M_t.
             super___uniq_ptr_impl<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFDebugNames_*,_std::default_delete<llvm::DWARFDebugNames>_>
             .super__Head_base<0UL,_llvm::DWARFDebugNames_*,_false>._M_head_impl;
  }
  return pDVar6;
}

Assistant:

const DWARFDebugNames &DWARFContext::getDebugNames() {
  return getAccelTable(Names, *DObj, DObj->getNamesSection(),
                       DObj->getStrSection(), isLittleEndian());
}